

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O2

_Bool binary_fuse8_populate(uint64_t *keys,uint32_t size,binary_fuse8_t *filter)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint32_t uVar13;
  int iVar14;
  uint32_t uVar15;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  void *__ptr_04;
  uint64_t uVar16;
  size_t __size;
  ulong uVar17;
  uint32_t i_1;
  ulong uVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  char cVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  _Bool _Var30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  ulong local_f8;
  uint32_t h012 [5];
  uint64_t rng_counter;
  
  if (filter->Size != size) {
    return false;
  }
  __size = (size_t)size;
  rng_counter = 0x726b2b9d438b9d4d;
  local_f8 = binary_fuse_rng_splitmix64(&rng_counter);
  filter->Seed = local_f8;
  __ptr = calloc((ulong)(size + 1),8);
  uVar17 = (ulong)filter->ArrayLength;
  __ptr_00 = malloc(uVar17 * 4);
  __ptr_01 = calloc(uVar17,1);
  __ptr_02 = malloc(__size);
  __ptr_03 = calloc(uVar17,8);
  cVar9 = '\0';
  do {
    cVar23 = cVar9;
    uVar32 = 1 << (cVar23 + 0x41U & 0x1f);
    cVar9 = cVar23 + '\x01';
  } while (uVar32 < filter->SegmentCount);
  __ptr_04 = malloc((ulong)uVar32 * 4);
  auVar34._0_4_ = -(uint)((int)((ulong)__ptr_00 >> 0x20) == 0 && (int)__ptr_00 == 0);
  auVar34._4_4_ = -(uint)((int)__ptr_01 == 0 && (int)((ulong)__ptr_01 >> 0x20) == 0);
  auVar34._8_4_ = -(uint)((int)((ulong)__ptr_02 >> 0x20) == 0 && (int)__ptr_02 == 0);
  auVar34._12_4_ = -(uint)((int)__ptr_03 == 0 && (int)((ulong)__ptr_03 >> 0x20) == 0);
  iVar11 = movmskps((int)__ptr_04,auVar34);
  _Var30 = false;
  if (((iVar11 == 0) && (__ptr != (void *)0x0)) && (__ptr_04 != (void *)0x0)) {
    *(undefined8 *)((long)__ptr + __size * 8) = 1;
    iVar11 = 0;
    while (iVar11 != 100) {
      iVar11 = iVar11 + 1;
      uVar12 = 0;
      for (uVar21 = 0; uVar32 != uVar21; uVar21 = uVar21 + 1) {
        *(uint *)((long)__ptr_04 + uVar21 * 4) = uVar12 >> (cVar23 + 0x41U & 0x1f);
        uVar12 = uVar12 + (int)__size;
      }
      uVar21 = __size & 0xffffffff;
      for (uVar31 = 0; uVar31 != uVar21; uVar31 = uVar31 + 1) {
        uVar16 = binary_fuse_murmur64(keys[uVar31] + local_f8);
        uVar22 = uVar16 >> (-(cVar23 + '\x01') & 0x3fU);
        while( true ) {
          uVar12 = *(uint *)((long)__ptr_04 + uVar22 * 4);
          if (*(long *)((long)__ptr + (ulong)uVar12 * 8) == 0) break;
          uVar22 = (ulong)((int)uVar22 + 1U & uVar32 - 1);
        }
        *(uint64_t *)((long)__ptr + (ulong)uVar12 * 8) = uVar16;
        *(uint *)((long)__ptr_04 + uVar22 * 4) = uVar12 + 1;
      }
      iVar14 = 0;
      bVar6 = false;
      for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
        uVar22 = *(ulong *)((long)__ptr + uVar31 * 8);
        uVar13 = binary_fuse8_hash(0,uVar22,filter);
        uVar33 = (ulong)uVar13;
        *(char *)((long)__ptr_01 + uVar33) = *(char *)((long)__ptr_01 + uVar33) + '\x04';
        puVar1 = (ulong *)((long)__ptr_03 + uVar33 * 8);
        *puVar1 = *puVar1 ^ uVar22;
        uVar13 = binary_fuse8_hash(1,uVar22,filter);
        uVar29 = (ulong)uVar13;
        *(byte *)((long)__ptr_01 + uVar29) = (*(byte *)((long)__ptr_01 + uVar29) ^ 1) + 4;
        puVar1 = (ulong *)((long)__ptr_03 + uVar29 * 8);
        *puVar1 = *puVar1 ^ uVar22;
        uVar13 = binary_fuse8_hash(2,uVar22,filter);
        uVar18 = (ulong)uVar13;
        bVar19 = *(char *)((long)__ptr_01 + uVar18) + 4;
        uVar2 = *(ulong *)((long)__ptr_03 + uVar18 * 8);
        uVar26 = uVar2 ^ uVar22;
        *(ulong *)((long)__ptr_03 + uVar18 * 8) = uVar26;
        bVar10 = bVar19 ^ 2;
        *(byte *)((long)__ptr_01 + uVar18) = bVar10;
        uVar3 = *(ulong *)((long)__ptr_03 + uVar33 * 8);
        uVar4 = *(ulong *)((long)__ptr_03 + uVar29 * 8);
        if (((uVar26 & uVar3 & uVar4) == 0) &&
           ((((uVar3 == 0 && (*(char *)((long)__ptr_01 + uVar33) == '\b')) ||
             ((uVar4 == 0 && (*(char *)((long)__ptr_01 + uVar29) == '\b')))) ||
            ((uVar2 == uVar22 && (bVar19 == 10)))))) {
          iVar14 = iVar14 + 1;
          *(char *)((long)__ptr_01 + uVar33) = *(char *)((long)__ptr_01 + uVar33) + -4;
          *(ulong *)((long)__ptr_03 + uVar33 * 8) = uVar3 ^ uVar22;
          bVar10 = *(byte *)((long)__ptr_01 + uVar29);
          puVar1 = (ulong *)((long)__ptr_03 + uVar29 * 8);
          *puVar1 = *puVar1 ^ uVar22;
          *(byte *)((long)__ptr_01 + uVar29) = (bVar10 ^ 1) - 4;
          bVar10 = (*(byte *)((long)__ptr_01 + uVar18) ^ 2) - 4;
          *(byte *)((long)__ptr_01 + uVar18) = bVar10;
          puVar1 = (ulong *)((long)__ptr_03 + uVar18 * 8);
          *puVar1 = *puVar1 ^ uVar22;
        }
        bVar8 = true;
        if (*(byte *)((long)__ptr_01 + uVar33) < 4) {
          bVar6 = bVar8;
        }
        bVar7 = bVar6;
        if (*(byte *)((long)__ptr_01 + uVar29) < 4) {
          bVar7 = bVar8;
        }
        bVar6 = bVar8;
        if (3 < bVar10) {
          bVar6 = bVar7;
        }
      }
      if (!bVar6) {
        uVar12 = 0;
        for (uVar31 = 0; uVar17 != uVar31; uVar31 = uVar31 + 1) {
          *(int *)((long)__ptr_00 + (ulong)uVar12 * 4) = (int)uVar31;
          uVar12 = uVar12 + ((*(byte *)((long)__ptr_01 + uVar31) & 0xfc) == 4);
        }
        local_f8 = 0;
        uVar25 = 0xffffffff;
        do {
          iVar24 = -uVar12;
          do {
            uVar12 = uVar12 - 1;
            uVar20 = (uint)local_f8;
            if (iVar24 == 0) {
              if (uVar20 + iVar14 == (int)__size) goto LAB_00103d4e;
              if (iVar14 != 0) {
                __size = binary_fuse_sort_and_remove_dup(keys,uVar21);
                uVar21 = __size & 0xffffffff;
              }
              goto LAB_00103cc3;
            }
            uVar31 = (ulong)*(uint *)((long)__ptr_00 + (ulong)uVar12 * 4);
            bVar10 = *(byte *)((long)__ptr_01 + uVar31);
            iVar24 = iVar24 + 1;
          } while ((bVar10 & 0xfc) != 4);
          uVar16 = *(uint64_t *)((long)__ptr_03 + uVar31 * 8);
          uVar13 = binary_fuse8_hash(1,uVar16,filter);
          h012[1] = uVar13;
          h012[2] = binary_fuse8_hash(2,uVar16,filter);
          h012[3] = binary_fuse8_hash(0,uVar16,filter);
          h012[4] = uVar13;
          uVar28 = bVar10 & 3;
          bVar27 = (byte)uVar28;
          *(byte *)((long)__ptr_02 + local_f8) = bVar27;
          *(uint64_t *)((long)__ptr + local_f8 * 8) = uVar16;
          local_f8 = (ulong)(uVar20 + 1);
          uVar31 = (ulong)h012[(ulong)uVar28 + 1];
          *(uint32_t *)((long)__ptr_00 + (ulong)uVar12 * 4) = h012[(ulong)uVar28 + 1];
          bVar10 = *(byte *)((long)__ptr_01 + uVar31);
          uVar12 = (uint)((bVar10 & 0xfc) == 8);
          bVar19 = bVar27 - 2;
          if (bVar27 < 2) {
            bVar19 = bVar27 + 1;
          }
          puVar1 = (ulong *)((long)__ptr_03 + uVar31 * 8);
          *puVar1 = *puVar1 ^ uVar16;
          *(byte *)((long)__ptr_01 + uVar31) = bVar19 ^ bVar10 - 4;
          uVar31 = (ulong)h012[uVar28 + 2];
          *(uint32_t *)((long)__ptr_00 + (ulong)(uVar12 - iVar24) * 4) = h012[uVar28 + 2];
          uVar12 = (((*(byte *)((long)__ptr_01 + uVar31) & 0xfc) == 8) + uVar12) - iVar24;
          bVar10 = (char)(uVar28 + 2) - 3;
          if ((ulong)uVar28 == 0) {
            bVar10 = 2;
          }
          *(byte *)((long)__ptr_01 + uVar31) = bVar10 ^ *(byte *)((long)__ptr_01 + uVar31) - 4;
          puVar1 = (ulong *)((long)__ptr_03 + uVar31 * 8);
          *puVar1 = *puVar1 ^ uVar16;
          uVar25 = uVar25 + 1;
        } while( true );
      }
LAB_00103cc3:
      memset(__ptr,0,uVar21 << 3);
      memset(__ptr_01,0,uVar17);
      memset(__ptr_03,0,uVar17 * 8);
      local_f8 = binary_fuse_rng_splitmix64(&rng_counter);
      filter->Seed = local_f8;
    }
    memset(filter->Fingerprints,0xff,(ulong)filter->ArrayLength);
    _Var30 = false;
  }
LAB_00103dfa:
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  free(__ptr_03);
  free(__ptr);
  free(__ptr_04);
  return _Var30;
LAB_00103d4e:
  for (; uVar25 < uVar20; uVar25 = uVar25 - 1) {
    uVar16 = *(uint64_t *)((long)__ptr + (ulong)uVar25 * 8);
    uVar17 = (ulong)*(byte *)((long)__ptr_02 + (ulong)uVar25);
    uVar13 = binary_fuse8_hash(0,uVar16,filter);
    h012[0] = uVar13;
    uVar15 = binary_fuse8_hash(1,uVar16,filter);
    h012[1] = uVar15;
    h012[2] = binary_fuse8_hash(2,uVar16,filter);
    h012[3] = uVar13;
    h012[4] = uVar15;
    puVar5 = filter->Fingerprints;
    puVar5[h012[uVar17]] =
         (byte)(uVar16 >> 0x20) ^ (byte)uVar16 ^ puVar5[h012[uVar17 + 1]] ^ puVar5[h012[uVar17 + 2]]
    ;
  }
  _Var30 = true;
  goto LAB_00103dfa;
}

Assistant:

static inline bool binary_fuse8_populate(uint64_t *keys, uint32_t size,
                           binary_fuse8_t *filter) {
  if (size != filter->Size) {
    return false;
  }

  uint64_t rng_counter = 0x726b2b9d438b9d4d;
  filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  uint64_t *reverseOrder = (uint64_t *)calloc((size + 1), sizeof(uint64_t));
  uint32_t capacity = filter->ArrayLength;
  uint32_t *alone = (uint32_t *)malloc(capacity * sizeof(uint32_t));
  uint8_t *t2count = (uint8_t *)calloc(capacity, sizeof(uint8_t));
  uint8_t *reverseH = (uint8_t *)malloc(size * sizeof(uint8_t));
  uint64_t *t2hash = (uint64_t *)calloc(capacity, sizeof(uint64_t));

  uint32_t blockBits = 1;
  while (((uint32_t)1 << blockBits) < filter->SegmentCount) {
    blockBits += 1;
  }
  uint32_t block = ((uint32_t)1 << blockBits);
  uint32_t *startPos = (uint32_t *)malloc((1U << blockBits) * sizeof(uint32_t));
  uint32_t h012[5];

  if ((alone == NULL) || (t2count == NULL) || (reverseH == NULL) ||
      (t2hash == NULL) || (reverseOrder == NULL) || (startPos == NULL)) {
    free(alone);
    free(t2count);
    free(reverseH);
    free(t2hash);
    free(reverseOrder);
    free(startPos);
    return false;
  }
  reverseOrder[size] = 1;
  for (int loop = 0; true; ++loop) {
    if (loop + 1 > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system)
      memset(filter->Fingerprints, 0xFF, filter->ArrayLength);
      free(alone);
      free(t2count);
      free(reverseH);
      free(t2hash);
      free(reverseOrder);
      free(startPos);
      return false;
    }

    for (uint32_t i = 0; i < block; i++) {
      // important : i * size would overflow as a 32-bit number in some
      // cases.
      startPos[i] = (uint32_t)((uint64_t)i * size) >> blockBits;
    }

    uint64_t maskblock = block - 1;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = binary_fuse_murmur64(keys[i] + filter->Seed);
      uint64_t segment_index = hash >> (64 - blockBits);
      while (reverseOrder[startPos[segment_index]] != 0) {
        segment_index++;
        segment_index &= maskblock;
      }
      reverseOrder[startPos[segment_index]] = hash;
      startPos[segment_index]++;
    }
    int error = 0;
    uint32_t duplicates = 0;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = reverseOrder[i];
      uint32_t h0 = binary_fuse8_hash(0, hash, filter);
      t2count[h0] += 4;
      t2hash[h0] ^= hash;
      uint32_t h1= binary_fuse8_hash(1, hash, filter);
      t2count[h1] += 4;
      t2count[h1] ^= 1U;
      t2hash[h1] ^= hash;
      uint32_t h2 = binary_fuse8_hash(2, hash, filter);
      t2count[h2] += 4;
      t2hash[h2] ^= hash;
      t2count[h2] ^= 2U;
      if ((t2hash[h0] & t2hash[h1] & t2hash[h2]) == 0) {
        if   (((t2hash[h0] == 0) && (t2count[h0] == 8))
          ||  ((t2hash[h1] == 0) && (t2count[h1] == 8))
          ||  ((t2hash[h2] == 0) && (t2count[h2] == 8))) {
					duplicates += 1;
 					t2count[h0] -= 4;
 					t2hash[h0] ^= hash;
 					t2count[h1] -= 4;
 					t2count[h1] ^= 1U;
 					t2hash[h1] ^= hash;
 					t2count[h2] -= 4;
 					t2count[h2] ^= 2U;
 					t2hash[h2] ^= hash;
        }
      }
      error = (t2count[h0] < 4) ? 1 : error;
      error = (t2count[h1] < 4) ? 1 : error;
      error = (t2count[h2] < 4) ? 1 : error;
    }
    if(error) {
      memset(reverseOrder, 0, sizeof(uint64_t) * size);
      memset(t2count, 0, sizeof(uint8_t) * capacity);
      memset(t2hash, 0, sizeof(uint64_t) * capacity);
      filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
      continue;
    }

    // End of key addition
    uint32_t Qsize = 0;
    // Add sets with one key to the queue.
    for (uint32_t i = 0; i < capacity; i++) {
      alone[Qsize] = i;
      Qsize += ((t2count[i] >> 2U) == 1) ? 1U : 0U;
    }
    uint32_t stacksize = 0;
    while (Qsize > 0) {
      Qsize--;
      uint32_t index = alone[Qsize];
      if ((t2count[index] >> 2U) == 1) {
        uint64_t hash = t2hash[index];

        //h012[0] = binary_fuse8_hash(0, hash, filter);
        h012[1] = binary_fuse8_hash(1, hash, filter);
        h012[2] = binary_fuse8_hash(2, hash, filter);
        h012[3] = binary_fuse8_hash(0, hash, filter); // == h012[0];
        h012[4] = h012[1];
        uint8_t found = t2count[index] & 3U;
        reverseH[stacksize] = found;
        reverseOrder[stacksize] = hash;
        stacksize++;
        uint32_t other_index1 = h012[found + 1];
        alone[Qsize] = other_index1;
        Qsize += ((t2count[other_index1] >> 2U) == 2 ? 1U : 0U);

        t2count[other_index1] -= 4;
        t2count[other_index1] ^= binary_fuse_mod3(found + 1);
        t2hash[other_index1] ^= hash;

        uint32_t other_index2 = h012[found + 2];
        alone[Qsize] = other_index2;
        Qsize += ((t2count[other_index2] >> 2U) == 2 ? 1U : 0U);
        t2count[other_index2] -= 4;
        t2count[other_index2] ^= binary_fuse_mod3(found + 2);
        t2hash[other_index2] ^= hash;
      }
    }
    if (stacksize + duplicates == size) {
      // success
      size = stacksize;
      break;
    }
    if(duplicates > 0) {
      size = (uint32_t)binary_fuse_sort_and_remove_dup(keys, size);
    }
    memset(reverseOrder, 0, sizeof(uint64_t) * size);
    memset(t2count, 0, sizeof(uint8_t) * capacity);
    memset(t2hash, 0, sizeof(uint64_t) * capacity);
    filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  }

  for (uint32_t i = size - 1; i < size; i--) {
    // the hash of the key we insert next
    uint64_t hash = reverseOrder[i];
    uint8_t xor2 = binary_fuse8_fingerprint(hash);
    uint8_t found = reverseH[i];
    h012[0] = binary_fuse8_hash(0, hash, filter);
    h012[1] = binary_fuse8_hash(1, hash, filter);
    h012[2] = binary_fuse8_hash(2, hash, filter);
    h012[3] = h012[0];
    h012[4] = h012[1];
    filter->Fingerprints[h012[found]] = (uint8_t)((uint32_t)xor2 ^
                                                  filter->Fingerprints[h012[found + 1]] ^
                                                  filter->Fingerprints[h012[found + 2]]);
  }
  free(alone);
  free(t2count);
  free(reverseH);
  free(t2hash);
  free(reverseOrder);
  free(startPos);
  return true;
}